

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::RepeatedField
          (RepeatedField<unsigned_int> *this,RepeatedField<unsigned_int> *other)

{
  LogMessage *pLVar1;
  uint *__dest;
  uint *__src;
  LogMessage local_60;
  LogFinisher local_21;
  
  this->current_size_ = 0;
  this->total_size_ = 0;
  this->arena_or_elements_ = (void *)0x0;
  if (other->current_size_ != 0) {
    Reserve(this,other->current_size_);
    AddNAlreadyReserved(this,other->current_size_);
    if (this->current_size_ < 1) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
                 ,0x526);
      pLVar1 = internal::LogMessage::operator<<
                         (&local_60,"CHECK failed: (index) < (current_size_): ");
      internal::LogFinisher::operator=(&local_21,pLVar1);
      internal::LogMessage::~LogMessage(&local_60);
    }
    __dest = elements(this);
    if (other->current_size_ < 1) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
                 ,0x511);
      pLVar1 = internal::LogMessage::operator<<
                         (&local_60,"CHECK failed: (index) < (current_size_): ");
      internal::LogFinisher::operator=(&local_21,pLVar1);
      internal::LogMessage::~LogMessage(&local_60);
    }
    __src = elements(other);
    memcpy(__dest,__src,(long)other->current_size_ << 2);
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(const RepeatedField& other)
    : current_size_(0), total_size_(0), arena_or_elements_(nullptr) {
  if (other.current_size_ != 0) {
    Reserve(other.size());
    AddNAlreadyReserved(other.size());
    CopyArray(Mutable(0), &other.Get(0), other.size());
  }
}